

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstate.c
# Opt level: O2

void preinit_thread(lua_State *L,global_State *g)

{
  L->l_G = g;
  L->stack = (StkId)0x0;
  L->openupval = (UpVal *)0x0;
  L->ci = (CallInfo *)0x0;
  L->nci = 0;
  L->stacksize = 0;
  L->twups = L;
  L->errorJmp = (lua_longjmp *)0x0;
  L->hook = (lua_Hook)0x0;
  L->basehookcount = 0;
  L->hookcount = 0;
  L->allowhook = '\x01';
  L->nny = 1;
  L->nCcalls = 0;
  L->hookmask = 0;
  L->status = '\0';
  L->errfunc = 0;
  return;
}

Assistant:

static void preinit_thread(lua_State *L, global_State *g) {
    G(L) = g;
    L->stack = NULL;
    L->ci = NULL;
    L->nci = 0;
    L->stacksize = 0;
    L->twups = L;  /* thread has no upvalues */
    L->errorJmp = NULL;
    L->nCcalls = 0;
    L->hook = NULL;
    L->hookmask = 0;
    L->basehookcount = 0;
    L->allowhook = 1;
    resethookcount(L);
    L->openupval = NULL;
    L->nny = 1;
    L->status = LUA_OK;
    L->errfunc = 0;
}